

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilksort-seq.c
# Opt level: O2

void scramble_array(ELM *arr,unsigned_long size)

{
  ELM EVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  
  uVar2 = rand_nxt;
  for (uVar3 = 0; size != uVar3; uVar3 = uVar3 + 1) {
    uVar2 = uVar2 * 0x41c64e6d + 0x3039;
    EVar1 = arr[uVar3];
    rand_nxt = uVar2;
    arr[uVar3] = arr[uVar2 % size];
    arr[uVar2 % size] = EVar1;
  }
  return;
}

Assistant:

void scramble_array(ELM *arr, unsigned long size)
{
    unsigned long i;
    unsigned long j;

    for (i = 0; i < size; ++i) {
        j = my_rand();
        j = j % size;
        swap(arr[i], arr[j]);
    }
}